

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
::do_line(jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
          *this,triplet<unsigned_short> *param_1)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  pixel_type *ppVar10;
  pixel_type *ppVar11;
  uint uVar12;
  sample_type sVar13;
  sample_type sVar14;
  sample_type sVar15;
  uint uVar16;
  int32_t iVar17;
  int32_t iVar18;
  int32_t iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int qs;
  uint predicted;
  uint start_index;
  uint uVar23;
  int qs_00;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int qs_01;
  uint uVar28;
  
  if (this->width_ != 0) {
    start_index = 0;
    do {
      ppVar10 = this->previous_line_;
      ppVar11 = this->current_line_;
      uVar1 = ppVar11[(long)(int)start_index + -1].field_0.v1;
      uVar26 = (uint)uVar1;
      uVar2 = ppVar11[(long)(int)start_index + -1].field_1.v2;
      uVar27 = (uint)uVar2;
      uVar3 = ppVar11[(long)(int)start_index + -1].field_2.v3;
      uVar20 = (uint)uVar3;
      uVar4 = ppVar10[(long)(int)start_index + -1].field_0.v1;
      uVar21 = (uint)ppVar10[(long)(int)start_index + -1].field_1.v2;
      uVar22 = (uint)ppVar10[(long)(int)start_index + -1].field_2.v3;
      uVar5 = ppVar10[(int)start_index].field_0.v1;
      uVar6 = ppVar10[(int)start_index].field_1.v2;
      uVar24 = start_index + 1;
      uVar7 = ppVar10[(int)uVar24].field_1.v2;
      uVar8 = ppVar10[(int)uVar24].field_2.v3;
      uVar9 = ppVar10[(int)start_index].field_2.v3;
      uVar16 = (uint)uVar9;
      uVar23 = (uint)uVar5;
      iVar17 = quantize_gradient(this,ppVar10[(int)uVar24].field_0.v1 - uVar23);
      uVar25 = (uint)uVar5 - (uint)uVar4;
      iVar18 = quantize_gradient(this,uVar25);
      iVar19 = quantize_gradient(this,uVar4 - uVar26);
      qs = (iVar17 * 9 + iVar18) * 9 + iVar19;
      uVar28 = (uint)uVar6;
      iVar17 = quantize_gradient(this,uVar7 - uVar28);
      iVar18 = quantize_gradient(this,uVar6 - uVar21);
      iVar19 = quantize_gradient(this,uVar21 - uVar27);
      qs_00 = (iVar17 * 9 + iVar18) * 9 + iVar19;
      iVar17 = quantize_gradient(this,uVar8 - uVar16);
      iVar18 = quantize_gradient(this,uVar16 - uVar22);
      iVar19 = quantize_gradient(this,uVar22 - uVar20);
      qs_01 = (iVar17 * 9 + iVar18) * 9 + iVar19;
      if ((qs_00 == 0 && qs == 0) && qs_01 == 0) {
        iVar17 = do_run_mode(this,start_index,(decoder_strategy *)0x0);
        uVar24 = iVar17 + start_index;
      }
      else {
        uVar12 = -(uint)(uVar5 < uVar1);
        predicted = uVar23;
        if ((-1 < (int)(uVar4 - uVar26 ^ uVar12)) &&
           (predicted = uVar26, -1 < (int)(uVar25 ^ uVar12))) {
          predicted = uVar23 + (uVar26 - uVar4);
        }
        sVar13 = do_regular(this,qs,(uint)this->current_line_[(int)start_index].field_0.v1,predicted
                            ,(decoder_strategy *)0x0);
        uVar23 = -(uint)(uVar6 < uVar2);
        uVar25 = uVar28;
        if ((-1 < (int)(uVar21 - uVar27 ^ uVar23)) &&
           (uVar25 = uVar27, -1 < (int)(uVar6 - uVar21 ^ uVar23))) {
          uVar25 = uVar28 + (uVar27 - uVar21);
        }
        sVar14 = do_regular(this,qs_00,(uint)this->current_line_[(int)start_index].field_1.v2,uVar25
                            ,(decoder_strategy *)0x0);
        uVar21 = -(uint)(uVar9 < uVar3);
        uVar23 = uVar16;
        if ((-1 < (int)(uVar22 - uVar20 ^ uVar21)) &&
           (uVar23 = uVar20, -1 < (int)(uVar16 - uVar22 ^ uVar21))) {
          uVar23 = uVar16 + (uVar20 - uVar22);
        }
        sVar15 = do_regular(this,qs_01,(uint)this->current_line_[(int)start_index].field_2.v3,uVar23
                            ,(decoder_strategy *)0x0);
        ppVar10 = this->current_line_;
        ppVar10[(int)start_index].field_0.v1 = sVar13;
        ppVar10[(int)start_index].field_1.v2 = sVar14;
        ppVar10[(int)start_index].field_2.v3 = sVar15;
      }
      start_index = uVar24;
    } while (uVar24 < this->width_);
  }
  return;
}

Assistant:

void do_line(triplet<sample_type>* /*template_selector*/)
    {
        int32_t index{};
        while (static_cast<uint32_t>(index) < width_)
        {
            const triplet<sample_type> ra{current_line_[index - 1]};
            const triplet<sample_type> rc{previous_line_[index - 1]};
            const triplet<sample_type> rb{previous_line_[index]};
            const triplet<sample_type> rd{previous_line_[index + 1]};

            const int32_t qs1{compute_context_id(quantize_gradient(rd.v1 - rb.v1), quantize_gradient(rb.v1 - rc.v1),
                                                 quantize_gradient(rc.v1 - ra.v1))};
            const int32_t qs2{compute_context_id(quantize_gradient(rd.v2 - rb.v2), quantize_gradient(rb.v2 - rc.v2),
                                                 quantize_gradient(rc.v2 - ra.v2))};
            const int32_t qs3{compute_context_id(quantize_gradient(rd.v3 - rb.v3), quantize_gradient(rb.v3 - rc.v3),
                                                 quantize_gradient(rc.v3 - ra.v3))};

            if (qs1 == 0 && qs2 == 0 && qs3 == 0)
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
            }
            else
            {
                triplet<sample_type> rx;
                rx.v1 = do_regular(qs1, current_line_[index].v1, get_predicted_value(ra.v1, rb.v1, rc.v1),
                                   static_cast<Strategy*>(nullptr));
                rx.v2 = do_regular(qs2, current_line_[index].v2, get_predicted_value(ra.v2, rb.v2, rc.v2),
                                   static_cast<Strategy*>(nullptr));
                rx.v3 = do_regular(qs3, current_line_[index].v3, get_predicted_value(ra.v3, rb.v3, rc.v3),
                                   static_cast<Strategy*>(nullptr));
                current_line_[index] = rx;
                ++index;
            }
        }
    }